

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

ZSTD_compressionParameters *
ZSTD_adjustCParams_internal
          (ZSTD_compressionParameters *__return_storage_ptr__,ZSTD_compressionParameters cPar,
          unsigned_long_long srcSize,size_t dictSize)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined8 uVar4;
  ZSTD_compressionParameters ZVar5;
  ZSTD_compressionParameters *in_RAX;
  uint uVar6;
  uint uVar7;
  unsigned_long_long uVar8;
  
  ZVar5 = cPar;
  auVar1 = vpaddd_avx(cPar._0_16_,_DAT_001b5ab0);
  auVar2 = vpminud_avx(auVar1,_DAT_001b5ac0);
  auVar1 = vpcmpeqd_avx(auVar1,auVar2);
  if (((((((auVar1 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
          (auVar1 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar1 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar1[0xf] < '\0')
       || (cPar.minMatch - 8 < 0xfffffffb)) || (0x20000 < cPar.targetLength)) ||
     (cPar.strategy + ~ZSTD_btultra2 < 0xfffffff7)) {
    __assert_fail("ZSTD_checkCParams(cPar)==0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2e4f,
                  "ZSTD_compressionParameters ZSTD_adjustCParams_internal(ZSTD_compressionParameters, unsigned long long, size_t)"
                 );
  }
  uVar8 = 0x201;
  if (dictSize == 0) {
    uVar8 = srcSize;
  }
  if (srcSize != 0xffffffffffffffff) {
    uVar8 = srcSize;
  }
  if ((uVar8 | dictSize) < 0x40000000) {
    uVar6 = 6;
    if (0x3f < uVar8 + dictSize) {
      uVar7 = (int)(uVar8 + dictSize) - 1;
      uVar6 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      uVar6 = (uVar6 ^ 0xffffffe0) + 0x21;
      if (cPar.windowLog <= uVar6) goto LAB_00115b8b;
    }
    cPar.windowLog = uVar6;
  }
LAB_00115b8b:
  if (cPar.windowLog + 1 < cPar.hashLog) {
    cPar.hashLog = cPar.windowLog + 1;
  }
  if (cPar.windowLog < (cPar.chainLog - 1) + (uint)(cPar.strategy < ZSTD_btlazy2)) {
    cPar.chainLog = (cPar.windowLog + 1) - (uint)(cPar.strategy < ZSTD_btlazy2);
  }
  if (cPar.windowLog < 10) {
    cPar.windowLog = 10;
  }
  uVar3 = ZVar5._12_8_;
  uVar4 = ZVar5._20_8_;
  __return_storage_ptr__->searchLog = (int)uVar3;
  __return_storage_ptr__->minMatch = (int)((ulong)uVar3 >> 0x20);
  __return_storage_ptr__->targetLength = (int)uVar4;
  __return_storage_ptr__->strategy = (int)((ulong)uVar4 >> 0x20);
  __return_storage_ptr__->windowLog = cPar.windowLog;
  __return_storage_ptr__->chainLog = cPar.chainLog;
  __return_storage_ptr__->hashLog = cPar.hashLog;
  __return_storage_ptr__->searchLog = cPar.searchLog;
  return in_RAX;
}

Assistant:

static ZSTD_compressionParameters
ZSTD_adjustCParams_internal(ZSTD_compressionParameters cPar,
                            unsigned long long srcSize,
                            size_t dictSize)
{
    static const U64 minSrcSize = 513; /* (1<<9) + 1 */
    static const U64 maxWindowResize = 1ULL << (ZSTD_WINDOWLOG_MAX-1);
    assert(ZSTD_checkCParams(cPar)==0);

    if (dictSize && srcSize == ZSTD_CONTENTSIZE_UNKNOWN)
        srcSize = minSrcSize;

    /* resize windowLog if input is small enough, to use less memory */
    if ( (srcSize < maxWindowResize)
      && (dictSize < maxWindowResize) )  {
        U32 const tSize = (U32)(srcSize + dictSize);
        static U32 const hashSizeMin = 1 << ZSTD_HASHLOG_MIN;
        U32 const srcLog = (tSize < hashSizeMin) ? ZSTD_HASHLOG_MIN :
                            ZSTD_highbit32(tSize-1) + 1;
        if (cPar.windowLog > srcLog) cPar.windowLog = srcLog;
    }
    if (cPar.hashLog > cPar.windowLog+1) cPar.hashLog = cPar.windowLog+1;
    {   U32 const cycleLog = ZSTD_cycleLog(cPar.chainLog, cPar.strategy);
        if (cycleLog > cPar.windowLog)
            cPar.chainLog -= (cycleLog - cPar.windowLog);
    }

    if (cPar.windowLog < ZSTD_WINDOWLOG_ABSOLUTEMIN)
        cPar.windowLog = ZSTD_WINDOWLOG_ABSOLUTEMIN;  /* minimum wlog required for valid frame header */

    return cPar;
}